

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O2

void __thiscall helics::apps::Player::sortTags(Player *this)

{
  string *__k;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  pointer pVVar1;
  pointer pMVar2;
  iterator iVar3;
  mapped_type *this_01;
  ValueSetter *vs;
  pointer pVVar4;
  MessageHolder *ms;
  pointer pMVar5;
  
  std::
  __sort<__gnu_cxx::__normal_iterator<helics::apps::ValueSetter*,std::vector<helics::apps::ValueSetter,std::allocator<helics::apps::ValueSetter>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(helics::apps::ValueSetter_const&,helics::apps::ValueSetter_const&)>>
            ((this->points).
             super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->points).
             super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
             ._M_impl.super__Vector_impl_data._M_finish,
             (_Iter_comp_iter<bool_(*)(const_helics::apps::ValueSetter_&,_const_helics::apps::ValueSetter_&)>
              )0x18da5d);
  std::
  __sort<__gnu_cxx::__normal_iterator<helics::apps::MessageHolder*,std::vector<helics::apps::MessageHolder,std::allocator<helics::apps::MessageHolder>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(helics::apps::MessageHolder_const&,helics::apps::MessageHolder_const&)>>
            ((this->messages).
             super__Vector_base<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
             ._M_impl.super__Vector_impl_data._M_start,
             (this->messages).
             super__Vector_base<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
             ._M_impl.super__Vector_impl_data._M_finish,
             (_Iter_comp_iter<bool_(*)(const_helics::apps::MessageHolder_&,_const_helics::apps::MessageHolder_&)>
              )0x18da77);
  pVVar1 = (this->points).
           super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this_00 = &this->tags;
  for (pVVar4 = (this->points).
                super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>
                ._M_impl.super__Vector_impl_data._M_start; pVVar4 != pVVar1; pVVar4 = pVVar4 + 1) {
    __k = &pVVar4->pubName;
    iVar3 = CLI::std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&this_00->_M_h,__k);
    if (iVar3.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<std::__cxx11::string&,std::__cxx11::string&>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)this_00,__k,&pVVar4->type);
    }
    else if (*(long *)((long)iVar3.
                             super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                             ._M_cur + 0x30) == 0) {
      this_01 = CLI::std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)this_00,__k);
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
      _M_assign(this_01,&pVVar4->type);
    }
  }
  pMVar2 = (this->messages).
           super__Vector_base<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pMVar5 = (this->messages).
                super__Vector_base<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>
                ._M_impl.super__Vector_impl_data._M_start; pMVar5 != pMVar2; pMVar5 = pMVar5 + 1) {
    std::
    _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
    ::_M_emplace_unique<std::__cxx11::string&>
              ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&this->epts,&(pMVar5->mess).source);
  }
  return;
}

Assistant:

void Player::sortTags()
{
    std::sort(points.begin(), points.end(), vComp);
    std::sort(messages.begin(), messages.end(), mComp);
    // collapse tags to the reduced list
    for (auto& vs : points) {
        auto fnd = tags.find(vs.pubName);
        if (fnd != tags.end()) {
            if (fnd->second.empty()) {
                tags[vs.pubName] = vs.type;
            }
        } else {
            tags.emplace(vs.pubName, vs.type);
        }
    }

    for (auto& ms : messages) {
        epts.emplace(ms.mess.source);
    }
}